

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O2

DeviceAPI * __thiscall
tvm::runtime::DeviceAPIManager::GetAPI(DeviceAPIManager *this,string *name,bool allow_missing)

{
  PackedFunc *pPVar1;
  DeviceAPI *pDVar2;
  ostream *poVar3;
  string factory;
  LogMessageFatal local_1a0;
  
  std::operator+(&factory,"device_api.",name);
  pPVar1 = Registry::Get(&factory);
  if (pPVar1 == (PackedFunc *)0x0) {
    if (!allow_missing) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/c_runtime_api.cc"
                 ,99);
      poVar3 = std::operator<<((ostream *)&local_1a0,"Check failed: allow_missing");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3,"Device API ");
      poVar3 = std::operator<<(poVar3,(string *)name);
      std::operator<<(poVar3," is not enabled.");
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
    }
    pDVar2 = (DeviceAPI *)0x0;
  }
  else {
    PackedFunc::operator()<>((PackedFunc *)&local_1a0);
    pDVar2 = (DeviceAPI *)TVMPODValue_::operator_cast_to_void_((TVMPODValue_ *)&local_1a0);
    TVMRetValue::~TVMRetValue((TVMRetValue *)&local_1a0);
  }
  std::__cxx11::string::~string((string *)&factory);
  return pDVar2;
}

Assistant:

DeviceAPI *GetAPI(const std::string name, bool allow_missing) {
    std::string factory = "device_api." + name;
    auto *f = Registry::Get(factory);
    if (f == nullptr) {
      CHECK(allow_missing)
          << "Device API " << name << " is not enabled.";
      return nullptr;
    }
    void *ptr = (*f)();
    return static_cast<DeviceAPI *>(ptr);
  }